

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

int __thiscall FBehavior::FindMapVarName(FBehavior *this,char *varname)

{
  int iVar1;
  DWORD *names;
  
  names = (DWORD *)FindChunk(this,0x5058454d);
  iVar1 = FindStringInChunk(this,names,varname);
  return iVar1;
}

Assistant:

int FBehavior::FindMapVarName (const char *varname) const
{
	return FindStringInChunk ((DWORD *)FindChunk (MAKE_ID('M','E','X','P')), varname);
}